

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::GetPsbtGlobal
          (ByteData *__return_storage_ptr__,ByteData *key_data,wally_psbt *psbt,bool *is_find)

{
  wally_map_item *pwVar1;
  CfdException *pCVar2;
  allocator local_99;
  Transaction tx;
  size_t index;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  
  if (psbt == (wally_psbt *)0x0) {
    tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
    tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3a5;
    tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ce3e7;
    logger::warn<>((CfdSourceLocation *)&tx,"psbt pointer is null");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)&tx,"psbt pointer is null.",(allocator *)&key);
    CfdException::CfdException(pCVar2,kCfdIllegalStateError,(string *)&tx);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (is_find != (bool *)0x0) {
    *is_find = false;
  }
  ByteData::GetBytes(&key,key_data);
  if (*key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == 0xfb) {
    if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3b6;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ce3e7;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    Serializer::Serializer((Serializer *)&tx);
    Serializer::AddDirectNumber((Serializer *)&tx,psbt->version);
    Serializer::Output(__return_storage_ptr__,(Serializer *)&tx);
    Serializer::~Serializer((Serializer *)&tx);
  }
  else if (*key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == '\0') {
    if ((long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != 1) {
      tx.super_AbstractTransaction._vptr_AbstractTransaction = (_func_int **)0x4b240b;
      tx.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x3ad;
      tx.vin_.super__Vector_base<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)anon_var_dwarf_5ce3e7;
      logger::warn<>((CfdSourceLocation *)&tx,"psbt invalid key format.");
      pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)&tx,"psbt invalid key format error.",(allocator *)&index);
      CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)&tx);
      __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    ConvertBitcoinTxFromWally((ByteData *)&index,psbt->tx,false);
    Transaction::Transaction(&tx,(ByteData *)&index);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&index);
    AbstractTransaction::GetData(__return_storage_ptr__,&tx.super_AbstractTransaction);
    Transaction::~Transaction(&tx);
  }
  else {
    index = 0;
    ::std::__cxx11::string::string((string *)&tx,"global unknowns",&local_99);
    FindPsbtMap(&psbt->unknowns,&key,(string *)&tx,&index);
    ::std::__cxx11::string::~string((string *)&tx);
    if (is_find != (bool *)0x0) {
      *is_find = true;
    }
    pwVar1 = (psbt->unknowns).items;
    ByteData::ByteData(__return_storage_ptr__,pwVar1[index].value,(uint32_t)pwVar1[index].value_len)
    ;
  }
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&key.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return __return_storage_ptr__;
}

Assistant:

static ByteData GetPsbtGlobal(
    const ByteData &key_data, struct wally_psbt *psbt, bool *is_find) {
  if (psbt == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }
  if (is_find != nullptr) *is_find = false;
  const auto key = key_data.GetBytes();
  bool has_key_1byte = (key.size() == 1);
  if (key[0] == Psbt::kPsbtGlobalUnsignedTx) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    Transaction tx(ConvertBitcoinTxFromWally(psbt->tx, false));
    return tx.GetData();
  } else if (key[0] == Psbt::kPsbtGlobalVersion) {
    if (!has_key_1byte) {
      warn(CFD_LOG_SOURCE, "psbt invalid key format.");
      throw CfdException(
          kCfdIllegalArgumentError, "psbt invalid key format error.");
    }
    if (is_find != nullptr) *is_find = true;
    // TODO(k-matsuzawa) need endian support.
    Serializer builder;
    builder.AddDirectNumber(psbt->version);
    return builder.Output();
  } else {
    size_t index = 0;
    try {
      FindPsbtMap(&psbt->unknowns, key, "global unknowns", &index);
      if (is_find != nullptr) *is_find = true;
      return ByteData(
          psbt->unknowns.items[index].value,
          static_cast<uint32_t>(psbt->unknowns.items[index].value_len));
    } catch (const CfdException &except) {
      if ((is_find == nullptr) ||
          (except.GetErrorCode() != kCfdIllegalArgumentError)) {
        throw except;
      }
    }
  }
  return ByteData();
}